

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::ignore_underscore(string *__return_storage_ptr__,string *item)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  undefined1 local_39;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  long local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  pcVar1 = (item->_M_dataplus)._M_p;
  local_38._M_current = (char *)&local_28;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + item->_M_string_length);
  local_39 = 0x5f;
  _Var2 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (local_38,local_38._M_current + local_30,(_Iter_equals_val<const_char>)&local_39
                    );
  *_Var2._M_current = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((size_type *)local_38._M_current == &local_28) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_current;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
  }
  __return_storage_ptr__->_M_string_length = (long)_Var2._M_current - (long)local_38._M_current;
  return __return_storage_ptr__;
}

Assistant:

inline std::string ignore_underscore(std::string item) { return detail::remove_underscore(item); }